

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

double feintrack::calc_center_mass(hist_cont *arr,double *area)

{
  pointer pdVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  
  *area = 0.0;
  pdVar1 = (arr->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(arr->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar2 == 0) {
    dVar4 = 0.0;
  }
  else {
    dVar5 = *area;
    lVar2 = lVar2 >> 3;
    dVar4 = 0.0;
    lVar3 = 0;
    do {
      dVar5 = dVar5 + pdVar1[lVar3];
      *area = dVar5;
      auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar6._0_8_ = lVar3;
      auVar6._12_4_ = 0x45300000;
      dVar4 = dVar4 + ((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) *
                      pdVar1[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
  }
  return dVar4 / *area;
}

Assistant:

double calc_center_mass(const hist_cont& arr, double& area)
	{
		double sum2(0.);
		area = 0.;
		for (size_t i = 0; i < arr.size(); ++i)
		{
			area += arr[i];
			sum2 += i * arr[i];
		}
		return sum2 /= area;
	}